

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  bool bVar1;
  Type *pTVar2;
  Diagnostic *pDVar3;
  TimingControl *pTVar4;
  bool local_d9;
  ConstantValue local_b8;
  SourceLocation local_90;
  SourceLocation local_88;
  undefined4 local_7c;
  SourceLocation local_78;
  SourceLocation local_70;
  undefined4 local_64;
  SourceLocation local_60;
  SourceLocation local_58;
  undefined4 local_4e;
  bool local_49;
  Symbol *pSStack_48;
  bool isClocking;
  Symbol *symRef;
  SignalEventControl *result;
  ASTContext *context_local;
  Expression *iffCondition_local;
  Expression *expr_local;
  Compilation *pCStack_18;
  EdgeKind edge_local;
  Compilation *compilation_local;
  
  result = (SignalEventControl *)context;
  context_local = (ASTContext *)iffCondition;
  iffCondition_local = expr;
  expr_local._4_4_ = edge;
  pCStack_18 = compilation;
  symRef = (Symbol *)
           BumpAllocator::
           emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,(EdgeKind *)((long)&expr_local + 4),expr,
                      (Expression **)&context_local,&sourceRange);
  bVar1 = Expression::bad(iffCondition_local);
  if (bVar1) {
    pTVar4 = TimingControl::badCtrl(pCStack_18,(TimingControl *)symRef);
    return pTVar4;
  }
  pSStack_48 = Expression::getSymbolReference(iffCondition_local,true);
  if ((pSStack_48 == (Symbol *)0x0) || (local_d9 = true, pSStack_48->kind != ClockingBlock)) {
    local_d9 = iffCondition_local->kind == ClockingEvent;
  }
  local_49 = local_d9;
  if (expr_local._4_4_ == None) {
    pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&iffCondition_local->type);
    bVar1 = Type::isAggregate(pTVar2);
    if (!bVar1) {
      pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&iffCondition_local->type);
      bVar1 = Type::isCHandle(pTVar2);
      if (!bVar1) {
        pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&iffCondition_local->type);
        bVar1 = Type::isPropertyType(pTVar2);
        if (!bVar1) {
          pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&iffCondition_local->type);
          bVar1 = Type::isVoid(pTVar2);
          if ((!bVar1) || ((local_49 & 1U) != 0)) goto LAB_0046c9f5;
        }
      }
    }
    local_4e = 0x1e0008;
    local_60 = (iffCondition_local->sourceRange).startLoc;
    local_58 = (iffCondition_local->sourceRange).endLoc;
    pDVar3 = ASTContext::addDiag((ASTContext *)result,(DiagCode)0x1e0008,
                                 iffCondition_local->sourceRange);
    pTVar2 = not_null<const_slang::ast::Type_*>::operator*(&iffCondition_local->type);
    ast::operator<<(pDVar3,pTVar2);
    compilation_local = (Compilation *)TimingControl::badCtrl(pCStack_18,(TimingControl *)symRef);
  }
  else {
    pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&iffCondition_local->type);
    bVar1 = Type::isIntegral(pTVar2);
    if (!bVar1) {
      if ((local_49 & 1U) == 0) {
        local_7c = 0x4b0007;
        local_90 = (iffCondition_local->sourceRange).startLoc;
        local_88 = (iffCondition_local->sourceRange).endLoc;
        pDVar3 = ASTContext::addDiag((ASTContext *)result,(DiagCode)0x4b0007,
                                     iffCondition_local->sourceRange);
        pTVar2 = not_null<const_slang::ast::Type_*>::operator*(&iffCondition_local->type);
        ast::operator<<(pDVar3,pTVar2);
      }
      else {
        local_64 = 0xa0008;
        local_78 = (iffCondition_local->sourceRange).startLoc;
        local_70 = (iffCondition_local->sourceRange).endLoc;
        ASTContext::addDiag((ASTContext *)result,(DiagCode)0xa0008,iffCondition_local->sourceRange);
      }
      pTVar4 = TimingControl::badCtrl(pCStack_18,(TimingControl *)symRef);
      return pTVar4;
    }
LAB_0046c9f5:
    if ((context_local == (ASTContext *)0x0) ||
       (bVar1 = ASTContext::requireBooleanConvertible
                          ((ASTContext *)result,(Expression *)context_local), bVar1)) {
      ASTContext::tryEval(&local_b8,(ASTContext *)result,iffCondition_local);
      bVar1 = slang::ConstantValue::operator_cast_to_bool(&local_b8);
      slang::ConstantValue::~ConstantValue(&local_b8);
      if (bVar1) {
        ASTContext::addDiag((ASTContext *)result,(DiagCode)0x4f0008,iffCondition_local->sourceRange)
        ;
      }
      compilation_local = (Compilation *)symRef;
    }
    else {
      compilation_local = (Compilation *)TimingControl::badCtrl(pCStack_18,(TimingControl *)symRef);
    }
  }
  return (TimingControl *)compilation_local;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed HierarchicalReferenceExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                      expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isCHandle() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    if (iffCondition) {
        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}